

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ushort *puVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 cord;
  string *s;
  ulong uVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  FieldEntry *extraout_RDX;
  FieldEntry *entry;
  ushort uVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 false_func;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 wire_bytes;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  uint16_t xform_val;
  uint64_t uVar11;
  uint *puVar12;
  pair<const_char_*,_int> pVar13;
  string_view wire_bytes_00;
  ushort local_4c;
  Arena *local_40;
  anon_class_8_1_a7a63227 local_38;
  
  aVar9.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((aVar9.data & 3) != 0) {
    AlignFail(aVar9.data);
  }
  if ((data.field_0._0_4_ & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0029cd09;
  }
  uVar2 = *(ushort *)(aVar9.data + 10);
  uVar10 = uVar2 & 0x30;
  if (uVar10 == 0x20) {
    pcVar6 = MpRepeatedString<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  local_4c = uVar2 & 0x600;
  uVar11 = hasbits;
  if (uVar10 == 0x10) {
    pbVar3 = (byte *)((long)&msg->_vptr_MessageLite + ((long)(int)*(uint *)(aVar9.data + 4) >> 3));
    *pbVar3 = *pbVar3 | '\x01' << (*(uint *)(aVar9.data + 4) & 7);
LAB_0029cd66:
    bVar4 = false;
    false_func = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
    wire_bytes = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
  }
  else {
    if (uVar10 != 0x30) goto LAB_0029cd66;
    data.field_0._0_4_ = data.field_0._0_4_ >> 3;
    data.field_0.data._4_4_ = 0;
    false_func.data = aVar9.data;
    wire_bytes = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    bVar4 = ChangeOneof(table,(FieldEntry *)aVar9,data.field_0._0_4_,(ParseContext *)data.field_0,
                        msg);
  }
  xform_val = (uint16_t)uVar11;
  if ((uVar2 & 0x1c0) == 0x80) {
    if (uVar10 == 0x30) {
      if (bVar4 == false) {
        wire_bytes.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar9;
        this.data = wire_bytes.data;
        if ((wire_bytes.data & 7) != 0) goto LAB_0029ce0e;
        cord.data = *wire_bytes.data;
      }
      else {
        local_40 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)local_40 & 1) != 0) {
          local_40 = *(Arena **)((ulong)local_40 & 0xfffffffffffffffe);
        }
        false_func.data = (uint64_t)&local_40;
        local_38.arena = local_40;
        cord = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               absl::lts_20240722::utility_internal::
               IfConstexprElse<false,google::protobuf::Arena::Create<absl::lts_20240722::Cord>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<absl::lts_20240722::Cord>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                         (&local_38,(anon_class_8_1_a7a63227 *)false_func);
        wire_bytes.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar9;
        this.data = wire_bytes.data;
        if ((wire_bytes.data & 7) != 0) {
LAB_0029ce0e:
          AlignFail(this.data);
        }
        *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)wire_bytes = cord;
      }
    }
    else {
      cord.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar9;
      this.data = cord.data;
      if ((cord.data & 7) != 0) goto LAB_0029ce0e;
    }
    bVar1 = *ptr;
    if ((char)bVar1 < '\0') {
      aVar9.data._4_4_ = 0;
      aVar9.data._0_4_ = CONCAT31(0,bVar1);
      wire_bytes = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
      pVar13 = ReadSizeFallback(ptr,CONCAT31(0,bVar1));
      ptr = (char *)aVar9;
    }
    else {
      pVar13.second._0_1_ = bVar1;
      pVar13.first = ptr + 1;
      pVar13._9_7_ = 0;
      ptr = (char *)false_func;
    }
    entry = pVar13._8_8_;
    aVar9.data = (uint64_t)pVar13.first;
    if (aVar9.data == 0) {
      puVar7 = (ushort *)0x0;
    }
    else {
      wire_bytes = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      puVar7 = (ushort *)
               EpsCopyInputStream::ReadCord
                         (&ctx->super_EpsCopyInputStream,(char *)aVar9,pVar13.second,(Cord *)cord);
      data.field_0 = cord;
      entry = extraout_RDX;
      ptr = (char *)aVar9;
    }
    bVar4 = puVar7 != (ushort *)0x0;
    if (bVar4) {
      data.field_0.data._2_6_ = 0;
      data.field_0.data._0_2_ = local_4c;
      MpVerifyUtf8((Cord *)wire_bytes,(TcParseTableBase *)ptr,entry,local_4c);
      bVar4 = true;
    }
  }
  else {
    if ((uVar2 & 0x1c0) != 0) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8a0);
    }
    this.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar9;
    if ((this.data & 7) != 0) goto LAB_0029ce0e;
    if (bVar4 != false) {
      *(undefined8 **)this = &fixed_address_empty_string_abi_cxx11_;
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if (((ulong)data.field_0 & 1) != 0) {
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                     ((ulong)data.field_0 & 0xfffffffffffffffe))->data;
    }
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0) {
      s = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)this,(Arena *)0x0);
      puVar7 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
    }
    else {
      puVar7 = (ushort *)
               EpsCopyInputStream::ReadArenaString
                         (&ctx->super_EpsCopyInputStream,ptr,(ArenaStringPtr *)this,
                          (Arena *)data.field_0);
    }
    if (puVar7 == (ushort *)0x0) {
      bVar4 = false;
    }
    else {
      ptr = (char *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                    (*(ulong *)this & 0xfffffffffffffffc))->data;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)ptr;
      bVar4 = MpVerifyUtf8((TcParser *)
                           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                           (*(ulong *)this & 0xfffffffffffffffc))[1],wire_bytes_00,
                           (TcParseTableBase *)aVar9,(FieldEntry *)(ulong)local_4c,xform_val);
      data.field_0 = aVar9;
    }
  }
  if ((bVar4 == false) || (puVar7 == (ushort *)0x0)) {
    pcVar6 = Error(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar7) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar12 & 3) != 0) {
        AlignFail(puVar12);
      }
      *puVar12 = *puVar12 | (uint)hasbits;
    }
    return (char *)puVar7;
  }
  uVar5 = (uint)table->fast_idx_mask & (uint)*puVar7;
  if ((uVar5 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar8 = (ulong)(uVar5 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*puVar7 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar8);
  ptr = (char *)puVar7;
LAB_0029cd09:
  pcVar6 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (!ptr) break;
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}